

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O0

IOFileUD * io_file_open(lua_State *L,char *mode)

{
  GCstr *pGVar1;
  IOFileUD *pIVar2;
  FILE *pFVar3;
  int *piVar4;
  char *pcVar5;
  IOFileUD *iof;
  char *fname;
  char *mode_local;
  lua_State *L_local;
  
  pGVar1 = lj_lib_checkstr(L,1);
  pIVar2 = io_file_new(L);
  pFVar3 = fopen64((char *)(pGVar1 + 1),mode);
  pIVar2->fp = (FILE *)pFVar3;
  if (pIVar2->fp == (FILE *)0x0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    pcVar5 = lj_strfmt_pushf(L,"%s: %s",pGVar1 + 1,pcVar5);
    luaL_argerror(L,1,pcVar5);
  }
  return pIVar2;
}

Assistant:

static IOFileUD *io_file_open(lua_State *L, const char *mode)
{
  const char *fname = strdata(lj_lib_checkstr(L, 1));
  IOFileUD *iof = io_file_new(L);
  iof->fp = fopen(fname, mode);
  if (iof->fp == NULL)
    luaL_argerror(L, 1, lj_strfmt_pushf(L, "%s: %s", fname, strerror(errno)));
  return iof;
}